

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O2

Vector<Indexing::CodeTree::CodeOp> *
Lib::Vector<Indexing::CodeTree::CodeOp>::allocate(size_t length)

{
  Vector<Indexing::CodeTree::CodeOp> *pVVar1;
  
  pVVar1 = (Vector<Indexing::CodeTree::CodeOp> *)Lib::alloc(length << 4 | 8);
  *(size_t *)pVVar1 = length;
  array_new<Indexing::CodeTree::CodeOp>(pVVar1 + 8,length);
  return pVVar1;
}

Assistant:

static Vector* allocate(size_t length)
  {
    ASS_G(length,0);

    size_t sz=sizeof(Vector) + (length-1)*sizeof(C);
    Vector* v = reinterpret_cast<Vector*>(ALLOC_KNOWN(sz,"Vector"));
    v->_length = length;
    C* arr = v->_array;
    // in the case C is a class with an initialiser, apply the constructor of it
    // to every element of the allocated array
    array_new<C>(arr,length);
    return v;
  }